

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O1

void __thiscall
Model_takeImportedUnitsByIndex_Test::TestBody(Model_takeImportedUnitsByIndex_Test *this)

{
  char cVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  ModelPtr model;
  UnitsPtr takeUnits2;
  UnitsPtr takeUnits1;
  long *local_58;
  unsigned_long local_50;
  internal local_48 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40 [2];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  undefined1 local_28 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  undefined1 local_18 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_10;
  
  commonSetupImportedUnits();
  libcellml::Model::takeUnits((ulong)local_18);
  libcellml::Model::takeUnits((ulong)local_28);
  local_58 = (long *)0x0;
  local_50 = libcellml::Model::unitsCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_48,"size_t(0)","model->unitsCount()",(unsigned_long *)&local_58,&local_50);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_40[0].ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_40[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/model/model.cpp"
               ,0x379,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
    if (local_58 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_58 != (long *)0x0)) {
        (**(code **)(*local_58 + 8))();
      }
      local_58 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  if (local_10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_10);
  }
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  return;
}

Assistant:

TEST(Model, takeImportedUnitsByIndex)
{
    auto model = commonSetupImportedUnits();

    auto takeUnits1 = model->takeUnits(0);
    auto takeUnits2 = model->takeUnits(0);

    EXPECT_EQ(size_t(0), model->unitsCount());
}